

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionTracking::TrackedSection::TrackedSection
          (TrackedSection *this,string *name,TrackedSection *parent)

{
  TrackedSection *parent_local;
  string *name_local;
  TrackedSection *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->m_runState = NotStarted;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
  ::map(&this->m_children);
  this->m_parent = parent;
  return;
}

Assistant:

TrackedSection( std::string const& name, TrackedSection* parent )
        :   m_name( name ), m_runState( NotStarted ), m_parent( parent )
        {}